

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SamplerTest.cpp
# Opt level: O3

void __thiscall
jaegertracing::samplers::Sampler_testProbabilisticSamplerPerformance_Test::TestBody
          (Sampler_testProbabilisticSamplerPerformance_Test *this)

{
  uint uVar1;
  result_type_conflict rVar2;
  ostream *poVar3;
  uint uVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  undefined1 auVar8 [16];
  default_random_engine randomGenerator;
  ProbabilisticSampler sampler;
  uniform_int_distribution<unsigned_long> distribution;
  random_device randomDevice;
  linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> local_1440;
  undefined1 *local_1438 [2];
  undefined1 local_1428 [16];
  byte local_1418 [8];
  vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_> local_1410;
  ProbabilisticSampler local_13f8;
  uniform_int_distribution<unsigned_long> local_13c8;
  random_device local_13b8;
  
  ProbabilisticSampler::ProbabilisticSampler(&local_13f8,0.001);
  std::random_device::random_device(&local_13b8);
  uVar1 = std::random_device::_M_getval();
  uVar4 = uVar1 / 0x7fffffff << 0x1f | uVar1 / 0x7fffffff;
  local_1440._M_x = (unsigned_long)(uVar4 + uVar1 + (uint)(uVar1 + uVar4 == 0));
  local_13c8._M_param._M_a = 0;
  local_13c8._M_param._M_b = 0xffffffffffffffff;
  lVar7 = 10000;
  lVar6 = 0;
  do {
    rVar2 = std::uniform_int_distribution<unsigned_long>::operator()
                      (&local_13c8,&local_1440,&local_13c8._M_param);
    local_1438[0] = local_1428;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1438,"op","");
    local_1418[0] = rVar2 <= local_13f8._samplingBoundary;
    std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>::vector
              (&local_1410,&local_13f8._tags);
    uVar5 = (ulong)local_1418[0];
    std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>::~vector(&local_1410);
    if (local_1438[0] != local_1428) {
      operator_delete(local_1438[0]);
    }
    lVar6 = lVar6 + uVar5;
    lVar7 = lVar7 + -1;
  } while (lVar7 != 0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Sampled: ",9);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," rate=",6);
  auVar8._8_4_ = (int)((ulong)lVar6 >> 0x20);
  auVar8._0_8_ = lVar6;
  auVar8._12_4_ = 0x45300000;
  poVar3 = std::ostream::_M_insert<double>
                     (((auVar8._8_8_ - 1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,(int)lVar6) - 4503599627370496.0)) / 10000.0);
  local_1418[0] = 10;
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)local_1418,1);
  std::random_device::_M_fini();
  local_13f8.super_Sampler._vptr_Sampler = (_func_int **)&PTR__ProbabilisticSampler_0020dcc8;
  std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>::~vector(&local_13f8._tags);
  return;
}

Assistant:

TEST(Sampler, testProbabilisticSamplerPerformance)
{
    constexpr auto kNumSamples = static_cast<uint64_t>(10000);

    ProbabilisticSampler sampler(0.001);
    std::random_device randomDevice;
    std::default_random_engine randomGenerator(randomDevice());
    std::uniform_int_distribution<uint64_t> distribution;
    auto count = static_cast<uint64_t>(0);
    for (auto i = static_cast<uint64_t>(0); i < kNumSamples; ++i) {
        TraceID id(0, distribution(randomGenerator));
        if (sampler.isSampled(id, kTestOperationName).isSampled()) {
            ++count;
        }
    }
    const auto rate = static_cast<double>(count) / kNumSamples;
    std::cout << "Sampled: " << count << " rate=" << rate << '\n';
}